

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O2

int rtosc_arg_vals_eq(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,size_t lsize,size_t rsize,
                     rtosc_cmp_options *opt)

{
  int iVar1;
  int iVar2;
  rtosc_arg_val_t *_lhs;
  rtosc_arg_val_t *_rhs;
  rtosc_cmp_options *opt_00;
  rtosc_arg_val_itr ritr;
  rtosc_arg_val_itr litr;
  rtosc_arg_val_t rrhs;
  rtosc_arg_val_t rlhs;
  
  rtosc_arg_val_itr_init(&litr,lhs);
  rtosc_arg_val_itr_init(&ritr,rhs);
  opt_00 = &default_cmp_options;
  if (opt != (rtosc_cmp_options *)0x0) {
    opt_00 = opt;
  }
  iVar2 = 1;
  while( true ) {
    iVar1 = rtosc_arg_vals_cmp_has_next(&litr,&ritr,lsize,rsize);
    if ((iVar1 == 0) || (iVar2 == 0)) break;
    _lhs = rtosc_arg_val_itr_get(&litr,&rlhs);
    _rhs = rtosc_arg_val_itr_get(&ritr,&rrhs);
    iVar2 = rtosc_arg_vals_eq_single(_lhs,_rhs,opt_00);
    rtosc_arg_val_itr_next(&litr);
    rtosc_arg_val_itr_next(&ritr);
  }
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = rtosc_arg_vals_eq_after_abort(&litr,&ritr,lsize,rsize);
  }
  return iVar2;
}

Assistant:

int rtosc_arg_vals_eq(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      size_t lsize, size_t rsize,
                      const rtosc_cmp_options* opt)
{
    // used if the value of lhs or rhs is range-computed:
    rtosc_arg_val_t rlhs, rrhs;

    rtosc_arg_val_itr litr, ritr;
    rtosc_arg_val_itr_init(&litr, lhs);
    rtosc_arg_val_itr_init(&ritr, rhs);

    int rval = 1;

    if(!opt)
        opt = &default_cmp_options;

    for( ; rtosc_arg_vals_cmp_has_next(&litr, &ritr, lsize, rsize) && rval;
        rtosc_arg_val_itr_next(&litr),
        rtosc_arg_val_itr_next(&ritr))
    {
        rval = rtosc_arg_vals_eq_single(rtosc_arg_val_itr_get(&litr, &rlhs),
                                        rtosc_arg_val_itr_get(&ritr, &rrhs),
                                        opt);
    }

    return rval
        ? rtosc_arg_vals_eq_after_abort(&litr, &ritr, lsize, rsize)
        : rval;
}